

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

State<wasm::HeapType> * __thiscall
wasm::anon_unknown_0::TypeMerging::makeDFAState
          (State<wasm::HeapType> *__return_storage_ptr__,TypeMerging *this,HeapType type)

{
  bool bVar1;
  reference pHVar2;
  value_type local_88;
  HeapType local_80;
  HeapType child;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_58;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_40;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> succs;
  TypeMerging *this_local;
  HeapType type_local;
  
  succs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  this_local = (TypeMerging *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
  HeapType::getHeapTypeChildren(&local_58,(HeapType *)&this_local);
  local_40 = &local_58;
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(local_40);
  child.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                *)&child);
    if (!bVar1) break;
    pHVar2 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    local_80.id = pHVar2->id;
    bVar1 = HeapType::isBasic(&local_80);
    if (!bVar1) {
      local_88.id = (uintptr_t)getMerged(this,local_80);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2,&local_88);
    }
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_58);
  (__return_storage_ptr__->val).id = (uintptr_t)this_local;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            (&__return_storage_ptr__->succs,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

DFA::State<HeapType> TypeMerging::makeDFAState(HeapType type) {
  std::vector<HeapType> succs;
  for (auto child : type.getHeapTypeChildren()) {
    // Both private and public heap type children participate in the DFA and are
    // eligible to be successors.
    if (!child.isBasic()) {
      succs.push_back(getMerged(child));
    }
  }
  return {type, std::move(succs)};
}